

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_rowcol_blocked_sse41_128_32
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  __m128i alVar1;
  parasail_result_t *ppVar2;
  undefined4 uVar3;
  int iVar4;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  __m128i *palVar11;
  int iVar12;
  __m128i *in_R10;
  int iVar13;
  long lVar14;
  size_t size;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i alVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar27;
  uint uVar28;
  undefined1 auVar26 [16];
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar34;
  int iVar35;
  undefined1 auVar32 [16];
  int iVar36;
  undefined1 auVar33 [16];
  int iVar38;
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar41 [16];
  int local_a8;
  __m128i_32_t t;
  parasail_result_t *local_80;
  char *local_78;
  char *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  __m128i_32_t e;
  
  uVar6 = (long)(s1Len + 3) / 4;
  iVar13 = (int)uVar6;
  local_78 = s1;
  local_70 = s2;
  ptr = parasail_memalign___m128i(0x10,(long)(iVar13 * 0x18));
  size = (size_t)iVar13;
  ptr_00 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  local_58 = ZEXT416((uint)open);
  local_68 = ZEXT416((uint)gap);
  local_80 = parasail_result_new_rowcol1(iVar13 * 4,s2Len);
  uVar5 = 0;
  if (0 < iVar13) {
    uVar5 = uVar6 & 0xffffffff;
  }
  iVar13 = 0;
  for (iVar4 = 0; local_a8 = (int)uVar5, iVar4 != 0x18; iVar4 = iVar4 + 1) {
    in_R10 = (__m128i *)0x0;
    pcVar10 = local_78;
    for (lVar8 = (long)iVar13; lVar8 != local_a8 + iVar13; lVar8 = lVar8 + 1) {
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        iVar7 = 0;
        if ((long)*in_R10 + lVar14 < (long)s1Len) {
          iVar7 = matrix->matrix[(long)matrix->mapper[(byte)pcVar10[lVar14]] * (long)matrix->size];
        }
        *(int *)((long)&t + lVar14 * 4) = iVar7;
      }
      alVar1[1] = t.m[1];
      alVar1[0] = t.m[0];
      ptr[lVar8] = alVar1;
      in_R10 = (__m128i *)((long)*in_R10 + 4);
      pcVar10 = pcVar10 + 4;
    }
    iVar13 = local_a8 + iVar13;
  }
  uVar3 = local_68._0_4_;
  auVar17._4_4_ = local_68._0_4_;
  auVar17._0_4_ = local_68._0_4_;
  auVar17._8_4_ = local_68._0_4_;
  auVar17._12_4_ = local_68._0_4_;
  iVar13 = 4;
  for (uVar6 = 0; ppVar2 = local_80, uVar6 != uVar5; uVar6 = uVar6 + 1) {
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      *(undefined4 *)((long)&t + lVar8 * 4) = 0;
      *(int *)((long)&e + lVar8 * 4) = -open;
    }
    ptr_00[uVar6][0] = t.m[0];
    ptr_00[uVar6][1] = t.m[1];
    ptr_01[uVar6][0] = e.m[0];
    ptr_01[uVar6][1] = e.m[1];
  }
  iVar4 = s1Len % 4;
  uVar6 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar15 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    uVar15 = uVar6;
  }
  auVar18 = (undefined1  [16])0x0;
  for (; uVar6 != uVar15; uVar6 = uVar6 + 1) {
    iVar7 = matrix->mapper[(byte)local_70[uVar6]];
    auVar32 = (undefined1  [16])0x0;
    uVar30 = 0xc0000000;
    for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
      alVar1 = ptr_00[uVar9];
      palVar11 = ptr_01 + uVar9;
      iVar21 = (int)(*palVar11)[0];
      iVar22 = *(int *)((long)*palVar11 + 4);
      iVar23 = (int)(*palVar11)[1];
      iVar24 = *(int *)((long)*palVar11 + 0xc);
      auVar26._0_8_ = alVar1[0] << 0x20;
      auVar26._8_8_ = alVar1[1] << 0x20 | alVar1[0] >> 0x20;
      auVar32 = auVar32 | auVar26;
      palVar11 = ptr + (long)iVar7 * size + uVar9;
      iVar31 = auVar32._0_4_ + (int)(*palVar11)[0];
      iVar34 = auVar32._4_4_ + *(int *)((long)*palVar11 + 4);
      iVar35 = auVar32._8_4_ + (int)(*palVar11)[1];
      iVar36 = auVar32._12_4_ + *(int *)((long)*palVar11 + 0xc);
      iVar12 = (uint)(-1 < iVar21) * iVar21;
      iVar38 = (uint)(-1 < iVar22) * iVar22;
      iVar39 = (uint)(-1 < iVar23) * iVar23;
      iVar40 = (uint)(-1 < iVar24) * iVar24;
      uVar25 = (uint)(iVar12 < iVar31) * iVar31 | (uint)(iVar12 >= iVar31) * iVar12;
      uVar27 = (uint)(iVar38 < iVar34) * iVar34 | (uint)(iVar38 >= iVar34) * iVar38;
      uVar28 = (uint)(iVar39 < iVar35) * iVar35 | (uint)(iVar39 >= iVar35) * iVar39;
      uVar29 = (uint)(iVar40 < iVar36) * iVar36 | (uint)(iVar40 >= iVar36) * iVar40;
      auVar33._0_4_ = uVar30 - local_58._0_4_;
      auVar33._4_4_ = uVar25 - local_58._0_4_;
      auVar33._8_4_ = uVar27 - local_58._0_4_;
      auVar33._12_4_ = uVar28 - local_58._0_4_;
      auVar32._0_4_ = -(uint)(0 < (int)auVar33._0_4_);
      auVar32._4_4_ = -(uint)(0 < (int)auVar33._4_4_);
      auVar32._8_4_ = -(uint)(0 < (int)auVar33._8_4_);
      auVar32._12_4_ = -(uint)(0 < (int)auVar33._12_4_);
      iVar12 = movmskps((int)in_R10,auVar32);
      auVar32 = auVar33;
      uVar30 = uVar29;
      if (iVar12 != 0) {
        while( true ) {
          auVar41._0_4_ = -(uint)(0 < auVar32._0_4_);
          auVar41._4_4_ = -(uint)(0 < auVar32._4_4_);
          auVar41._8_4_ = -(uint)(0 < auVar32._8_4_);
          auVar41._12_4_ = -(uint)(0 < auVar32._12_4_);
          iVar12 = movmskps(iVar12,auVar41);
          iVar38 = auVar33._0_4_;
          iVar39 = auVar33._4_4_;
          iVar40 = auVar33._8_4_;
          iVar31 = auVar33._12_4_;
          if (iVar12 == 0) break;
          iVar34 = -uVar3;
          auVar37._4_4_ = auVar32._0_4_ - uVar3;
          auVar37._0_4_ = iVar34;
          auVar37._8_4_ = auVar32._4_4_ - uVar3;
          auVar37._12_4_ = auVar32._8_4_ - uVar3;
          auVar33._0_4_ = (uint)(iVar38 < iVar34) * iVar34 | (uint)(iVar38 >= iVar34) * iVar38;
          auVar33._4_4_ =
               (uint)(iVar39 < auVar37._4_4_) * auVar37._4_4_ |
               (uint)(iVar39 >= auVar37._4_4_) * iVar39;
          auVar33._8_4_ =
               (uint)(iVar40 < auVar37._8_4_) * auVar37._8_4_ |
               (uint)(iVar40 >= auVar37._8_4_) * iVar40;
          auVar33._12_4_ =
               (uint)(iVar31 < auVar37._12_4_) * auVar37._12_4_ |
               (uint)(iVar31 >= auVar37._12_4_) * iVar31;
          auVar32 = auVar37;
        }
        uVar25 = (uint)((int)uVar25 < iVar38) * iVar38 | ((int)uVar25 >= iVar38) * uVar25;
        uVar27 = (uint)((int)uVar27 < iVar39) * iVar39 | ((int)uVar27 >= iVar39) * uVar27;
        uVar28 = (uint)((int)uVar28 < iVar40) * iVar40 | ((int)uVar28 >= iVar40) * uVar28;
        uVar29 = (uint)((int)uVar29 < iVar31) * iVar31 | ((int)uVar29 >= iVar31) * uVar29;
        iVar31 = iVar31 + (local_58._0_4_ - uVar3);
        uVar30 = (iVar31 < (int)uVar29) * uVar29 | (uint)(iVar31 >= (int)uVar29) * iVar31;
      }
      in_R10 = ptr_00 + uVar9;
      palVar11 = ptr_01 + uVar9;
      auVar32 = (undefined1  [16])alVar1 >> 0x60;
      *(uint *)*in_R10 = uVar25;
      *(uint *)((long)*in_R10 + 4) = uVar27;
      *(uint *)(*in_R10 + 1) = uVar28;
      *(uint *)((long)*in_R10 + 0xc) = uVar29;
      iVar12 = auVar18._0_4_;
      auVar19._0_4_ = (iVar12 < (int)uVar25) * uVar25 | (uint)(iVar12 >= (int)uVar25) * iVar12;
      iVar12 = auVar18._4_4_;
      auVar19._4_4_ = (iVar12 < (int)uVar27) * uVar27 | (uint)(iVar12 >= (int)uVar27) * iVar12;
      iVar12 = auVar18._8_4_;
      iVar38 = auVar18._12_4_;
      auVar19._8_4_ = (iVar12 < (int)uVar28) * uVar28 | (uint)(iVar12 >= (int)uVar28) * iVar12;
      auVar19._12_4_ = (iVar38 < (int)uVar29) * uVar29 | (uint)(iVar38 >= (int)uVar29) * iVar38;
      iVar12 = uVar25 - local_58._0_4_;
      iVar38 = uVar27 - local_58._0_4_;
      iVar39 = uVar28 - local_58._0_4_;
      iVar40 = uVar29 - local_58._0_4_;
      iVar21 = iVar21 - uVar3;
      iVar22 = iVar22 - uVar3;
      iVar23 = iVar23 - uVar3;
      iVar24 = iVar24 - uVar3;
      *(uint *)*palVar11 = (uint)(iVar21 < iVar12) * iVar12 | (uint)(iVar21 >= iVar12) * iVar21;
      *(uint *)((long)*palVar11 + 4) =
           (uint)(iVar22 < iVar38) * iVar38 | (uint)(iVar22 >= iVar38) * iVar22;
      *(uint *)(*palVar11 + 1) =
           (uint)(iVar23 < iVar39) * iVar39 | (uint)(iVar23 >= iVar39) * iVar23;
      *(uint *)((long)*palVar11 + 0xc) =
           (uint)(iVar24 < iVar40) * iVar40 | (uint)(iVar24 >= iVar40) * iVar24;
      auVar18 = auVar19;
    }
    alVar20 = ptr_00[size - 1];
    iVar7 = iVar4;
    while( true ) {
      bVar16 = iVar7 == 0;
      iVar7 = iVar7 + -1;
      uVar9 = alVar20[0];
      lVar8 = alVar20[1];
      if (bVar16) break;
      alVar20[0] = uVar9 << 0x10;
      alVar20[1] = lVar8 << 0x10 | uVar9 >> 0x30;
    }
    ((local_80->field_4).rowcols)->score_row[uVar6] = (int)alVar20[1]._6_2_;
  }
  for (lVar8 = 0; uVar5 << 4 != lVar8; lVar8 = lVar8 + 0x10) {
    auVar17 = pmovsxwd(auVar17,*(undefined8 *)((long)*ptr_00 + lVar8));
    *(undefined1 (*) [16])((long)((local_80->field_4).rowcols)->score_col + lVar8) = auVar17;
  }
  iVar4 = -0x40000000;
  while (bVar16 = iVar13 != 0, iVar13 = iVar13 + -1, bVar16) {
    uVar6 = auVar18._0_8_;
    lVar8 = auVar18._8_8_;
    if (iVar4 < auVar18._12_4_) {
      iVar4 = auVar18._12_4_;
    }
    auVar18._0_8_ = uVar6 << 0x20;
    auVar18._8_8_ = lVar8 << 0x20 | uVar6 >> 0x20;
  }
  local_80->score = iVar4;
  local_80->flag = local_80->flag | 0x8242004;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar2;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 4; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_32;
    __m128i vGapO = _mm_set1_epi32(open);
    __m128i vGapE = _mm_set1_epi32(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi32(NEG_INF_32);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_32_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 12); /* rshift 3 */
            vH = _mm_slli_si128(vH, 4); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi32(vH, vP);
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vZero);

            vF = _mm_srli_si128(vF, 12);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 4));
            vF = _mm_sub_epi32(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi32(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi32(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 4);
                    vT2 = _mm_sub_epi32(vT2, vGapE);
                    vF = _mm_max_epi32(vF, vT2);
                }
                vH = _mm_max_epi32(vH, vF);
                vF = _mm_add_epi32(vF, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                vF = _mm_max_epi32(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vMaxH, vH);

            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int32_t value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}